

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Function::addBlock(Function *this,Block *block)

{
  Block *local_18;
  Block *block_local;
  Function *this_local;
  
  local_18 = block;
  block_local = (Block *)this;
  std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back(&this->blocks,&local_18);
  return;
}

Assistant:

void addBlock(Block* block) { blocks.push_back(block); }